

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O2

int Abc_NtkFlattenHierarchyGia_rec
              (Gia_Man_t *pNew,Vec_Ptr_t *vSupers,Abc_Obj_t *pObj,Vec_Ptr_t *vBuffers)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pAVar4;
  long lVar5;
  
  if ((pObj->field_6).iTemp != -1) {
    return (pObj->field_6).iTemp;
  }
  switch(*(uint *)&pObj->field_0x14 & 0xf) {
  case 2:
    pAVar4 = (Abc_Obj_t *)Vec_PtrPop(vSupers);
    pAVar3 = Abc_ObjModel(pAVar4);
    iVar2 = (pAVar4->vFanins).nSize;
    if (iVar2 != pAVar3->vPis->nSize) {
      __assert_fail("Abc_ObjFaninNum(pBox) == Abc_NtkPiNum(pModel)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                    ,0x184,
                    "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                   );
    }
    iVar1 = (pObj->field_5).iData;
    if (((long)iVar1 < 0) || (iVar2 <= iVar1)) {
      __assert_fail("pObj->iData >= 0 && pObj->iData < Abc_NtkPiNum(pModel)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                    ,0x185,
                    "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                   );
    }
    iVar2 = Abc_NtkFlattenHierarchyGia_rec
                      (pNew,vSupers,
                       (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[iVar1]],
                       vBuffers);
    Vec_PtrPush(vSupers,pAVar4);
    pAVar4 = pObj;
    break;
  case 3:
  case 4:
  case 6:
    iVar2 = Abc_NtkFlattenHierarchyGia_rec
                      (pNew,vSupers,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],
                       vBuffers);
    goto LAB_006aa0d4;
  case 5:
    pAVar4 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
    if ((*(uint *)&pAVar4->field_0x14 & 0xf) != 10 && (*(uint *)&pAVar4->field_0x14 & 0xe) != 8) {
      __assert_fail("Abc_ObjIsBox(pBox)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                    ,400,
                    "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                   );
    }
    Vec_PtrPush(vSupers,pAVar4);
    pAVar3 = Abc_ObjModel(pAVar4);
    iVar2 = (pAVar4->vFanouts).nSize;
    if (iVar2 != pAVar3->vPos->nSize) {
      __assert_fail("Abc_ObjFanoutNum(pBox) == Abc_NtkPoNum(pModel)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                    ,0x194,
                    "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                   );
    }
    iVar1 = (pObj->field_5).iData;
    if ((iVar1 < 0) || (iVar2 <= iVar1)) {
      __assert_fail("pObj->iData >= 0 && pObj->iData < Abc_NtkPoNum(pModel)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                    ,0x195,
                    "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                   );
    }
    pAVar4 = Abc_NtkPo(pAVar3,iVar1);
    iVar2 = Abc_NtkFlattenHierarchyGia_rec(pNew,vSupers,pAVar4,vBuffers);
    Vec_PtrPop(vSupers);
    break;
  case 7:
    for (lVar5 = 0; lVar5 < (pObj->vFanins).nSize; lVar5 = lVar5 + 1) {
      Abc_NtkFlattenHierarchyGia_rec
                (pNew,vSupers,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar5]],
                 vBuffers);
    }
    iVar2 = Abc_NodeStrashToGia(pNew,pObj);
    goto LAB_006aa0d4;
  default:
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                  ,0x19d,
                  "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                 );
  }
  if (vBuffers != (Vec_Ptr_t *)0x0) {
    Vec_PtrPush(vBuffers,pAVar4);
    iVar2 = Gia_ManAppendBuf(pNew,iVar2);
  }
LAB_006aa0d4:
  (pObj->field_6).iTemp = iVar2;
  return iVar2;
}

Assistant:

int Abc_NtkFlattenHierarchyGia_rec( Gia_Man_t * pNew, Vec_Ptr_t * vSupers, Abc_Obj_t * pObj, Vec_Ptr_t * vBuffers )
{
    Abc_Ntk_t * pModel;
    Abc_Obj_t * pBox, * pFanin;  
    int iLit, i;
    if ( pObj->iTemp != -1 )
        return pObj->iTemp;
    if ( Abc_ObjIsNet(pObj) || Abc_ObjIsPo(pObj) || Abc_ObjIsBi(pObj) )
        return (pObj->iTemp = Abc_NtkFlattenHierarchyGia_rec(pNew, vSupers, Abc_ObjFanin0(pObj), vBuffers));
    if ( Abc_ObjIsPi(pObj) )
    {
        pBox   = (Abc_Obj_t *)Vec_PtrPop( vSupers );
        pModel = Abc_ObjModel(pBox);
        //printf( "   Exiting %s\n", Abc_NtkName(pModel) );
        assert( Abc_ObjFaninNum(pBox) == Abc_NtkPiNum(pModel) );
        assert( pObj->iData >= 0 && pObj->iData < Abc_NtkPiNum(pModel) );
        pFanin = Abc_ObjFanin( pBox, pObj->iData );
        iLit   = Abc_NtkFlattenHierarchyGia_rec( pNew, vSupers, pFanin, vBuffers );
        Vec_PtrPush( vSupers, pBox );
        //if ( vBuffers ) Vec_PtrPush( vBuffers, pFanin ); // save BI
        if ( vBuffers ) Vec_PtrPush( vBuffers, pObj );   // save PI
        return (pObj->iTemp = (vBuffers ? Gia_ManAppendBuf(pNew, iLit) : iLit));
    }
    if ( Abc_ObjIsBo(pObj) )
    {
        pBox   = Abc_ObjFanin0(pObj);
        assert( Abc_ObjIsBox(pBox) );
        Vec_PtrPush( vSupers, pBox );
        pModel = Abc_ObjModel(pBox);
        //printf( "Entering %s\n", Abc_NtkName(pModel) );
        assert( Abc_ObjFanoutNum(pBox) == Abc_NtkPoNum(pModel) );
        assert( pObj->iData >= 0 && pObj->iData < Abc_NtkPoNum(pModel) );
        pFanin = Abc_NtkPo( pModel, pObj->iData );
        iLit   = Abc_NtkFlattenHierarchyGia_rec( pNew, vSupers, pFanin, vBuffers );
        Vec_PtrPop( vSupers );
        //if ( vBuffers ) Vec_PtrPush( vBuffers, pObj );   // save BO
        if ( vBuffers ) Vec_PtrPush( vBuffers, pFanin ); // save PO
        return (pObj->iTemp = (vBuffers ? Gia_ManAppendBuf(pNew, iLit) : iLit));
    }
    assert( Abc_ObjIsNode(pObj) );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_NtkFlattenHierarchyGia_rec( pNew, vSupers, pFanin, vBuffers );
    return (pObj->iTemp = Abc_NodeStrashToGia( pNew, pObj ));
}